

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_catalog_entry.cpp
# Opt level: O3

void __thiscall
duckdb::TableCatalogEntry::BindUpdateConstraints
          (TableCatalogEntry *this,Binder *binder,LogicalGet *get,LogicalProjection *proj,
          LogicalUpdate *update,ClientContext *context)

{
  pointer pPVar1;
  pointer pCVar2;
  undefined2 *puVar3;
  bool bVar4;
  pointer pBVar5;
  BoundCheckConstraint *pBVar6;
  ColumnList *pCVar7;
  ColumnDefinition *pCVar8;
  iterator iVar9;
  LogicalType *this_00;
  undefined2 *puVar10;
  idx_t iVar11;
  unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>
  *constraint;
  pointer this_01;
  pointer pPVar12;
  ColumnListIterator CVar13;
  TableStorageInfo table_storage_info;
  physical_index_set_t all_columns;
  vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
  bound_constraints;
  ColumnLogicalIteratorInternal local_f8;
  undefined1 local_d8 [16];
  undefined2 *local_c8;
  undefined2 *local_c0;
  LogicalGet *local_b8;
  LogicalProjection *local_b0;
  ColumnList *local_a8;
  _Hashtable<duckdb::PhysicalIndex,duckdb::PhysicalIndex,std::allocator<duckdb::PhysicalIndex>,std::__detail::_Identity,std::equal_to<duckdb::PhysicalIndex>,duckdb::PhysicalIndexHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *local_a0;
  undefined1 local_98 [56];
  _Prime_rehash_policy local_60;
  __node_base_ptr local_50;
  vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
  local_48;
  
  local_a8 = &this->columns;
  local_b8 = get;
  local_b0 = proj;
  local_60._M_next_resize = (size_t)context;
  Binder::BindConstraints
            ((vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
              *)&local_48,binder,&this->constraints,
             &(this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name,local_a8);
  for (this_01 = local_48.
                 super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      this_01 !=
      local_48.
      super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; this_01 = this_01 + 1) {
    pBVar5 = unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>
             ::operator->(this_01);
    if (pBVar5->type == CHECK) {
      pBVar5 = unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>
               ::operator->(this_01);
      pBVar6 = BoundConstraint::Cast<duckdb::BoundCheckConstraint>(pBVar5);
      LogicalUpdate::BindExtraColumns(this,local_b8,local_b0,update,&pBVar6->bound_columns);
    }
  }
  if (update->return_chunk != false) {
    local_98._0_8_ = local_98 + 0x30;
    local_98._8_8_ = &DAT_00000001;
    local_98._16_8_ = (pointer)0x0;
    local_98._24_8_ = (__buckets_ptr)0x0;
    local_98._32_4_ = 0x3f800000;
    local_98._40_8_ = (_Hash_node_base *)0x0;
    local_98._48_8_ = (__node_base_ptr)0x0;
    CVar13 = ColumnList::Physical(local_a8);
    pCVar7 = CVar13.list;
    local_d8[8] = CVar13.physical;
    if (((undefined1  [16])CVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      pCVar2 = (pCVar7->columns).
               super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
               super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_c0 = (undefined2 *)
                 (((long)pCVar2 -
                   (long)(pCVar7->columns).
                         super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                         .
                         super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed);
      puVar10 = (undefined2 *)
                (((long)pCVar2 -
                  (long)(pCVar7->columns).
                        super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        .
                        super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed);
    }
    else {
      puVar10 = (undefined2 *)
                ((long)(pCVar7->physical_columns).
                       super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(pCVar7->physical_columns).
                       super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3);
      local_c0 = puVar10;
    }
    local_c8 = (undefined2 *)0x0;
    local_d8._0_8_ = pCVar7;
    while (((local_c8 != puVar10 || (local_c0 != puVar10)) ||
           ((ColumnList *)local_d8._0_8_ != pCVar7))) {
      pCVar8 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*
                         ((ColumnLogicalIteratorInternal *)local_d8);
      local_a0 = (_Hashtable<duckdb::PhysicalIndex,duckdb::PhysicalIndex,std::allocator<duckdb::PhysicalIndex>,std::__detail::_Identity,std::equal_to<duckdb::PhysicalIndex>,duckdb::PhysicalIndexHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)ColumnDefinition::Physical(pCVar8);
      local_f8.list = (ColumnList *)local_98;
      ::std::
      _Hashtable<duckdb::PhysicalIndex,duckdb::PhysicalIndex,std::allocator<duckdb::PhysicalIndex>,std::__detail::_Identity,std::equal_to<duckdb::PhysicalIndex>,duckdb::PhysicalIndexHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<duckdb::PhysicalIndex,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::PhysicalIndex,true>>>>
                ((_Hashtable<duckdb::PhysicalIndex,duckdb::PhysicalIndex,std::allocator<duckdb::PhysicalIndex>,std::__detail::_Identity,std::equal_to<duckdb::PhysicalIndex>,duckdb::PhysicalIndexHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)local_98,&local_a0,&local_f8);
      local_c8 = (undefined2 *)((long)local_c8 + 1);
    }
    LogicalUpdate::BindExtraColumns(this,local_b8,local_b0,update,(physical_index_set_t *)local_98);
    ::std::
    _Hashtable<duckdb::PhysicalIndex,_duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::PhysicalIndex>,_duckdb::PhysicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<duckdb::PhysicalIndex,_duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::PhysicalIndex>,_duckdb::PhysicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_98);
  }
  update->update_is_del_and_insert = false;
  (*(this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry[0x17])
            (local_d8,this,local_60._M_next_resize);
  puVar3 = local_c8;
  puVar10 = (undefined2 *)CONCAT71(local_d8._9_7_,local_d8[8]);
  if (puVar10 != local_c8) {
    pCVar7 = (ColumnList *)(local_98 + 8);
    do {
      local_98[2] = *(undefined1 *)(puVar10 + 1);
      local_98._0_2_ = *puVar10;
      local_98._8_8_ = (pointer)0x0;
      local_98._16_8_ = *(undefined8 *)(puVar10 + 8);
      local_98._24_8_ = (__buckets_ptr)0x0;
      local_98._32_8_ = *(undefined8 *)(puVar10 + 0x10);
      local_98._40_8_ = *(undefined8 *)(puVar10 + 0x14);
      local_98._48_8_ = *(undefined8 *)(puVar10 + 0x18);
      local_60._M_max_load_factor = 0.0;
      local_60._4_4_ = 0;
      local_f8.list = pCVar7;
      ::std::
      _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_assign<std::_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)pCVar7,
                 (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)(puVar10 + 4),
                 (_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,_false>_>_> *)
                 &local_f8);
      pPVar1 = (update->columns).
               super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
               super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (pPVar12 = (update->columns).
                     super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
                     super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                     ._M_impl.super__Vector_impl_data._M_start; pPVar12 != pPVar1;
          pPVar12 = pPVar12 + 1) {
        iVar9 = ::std::
                _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::find((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)pCVar7,&pPVar12->index);
        if (iVar9.super__Node_iterator_base<unsigned_long,_false>._M_cur != (__node_type *)0x0) {
          update->update_is_del_and_insert = true;
          break;
        }
      }
      ::std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)pCVar7);
      puVar10 = puVar10 + 0x20;
    } while (puVar10 != puVar3);
  }
  pPVar12 = (update->columns).
            super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
            super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pPVar1 = (update->columns).
           super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
           super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl
           .super__Vector_impl_data._M_finish;
  do {
    if (pPVar12 == pPVar1) {
LAB_0156cd1a:
      if (update->update_is_del_and_insert == true) {
        local_98._0_8_ = local_98 + 0x30;
        local_98._8_8_ = &DAT_00000001;
        local_98._16_8_ = (pointer)0x0;
        local_98._24_8_ = (__buckets_ptr)0x0;
        local_98._32_4_ = 0x3f800000;
        local_98._40_8_ = (_Hash_node_base *)0x0;
        local_98._48_8_ = (__node_base_ptr)0x0;
        CVar13 = ColumnList::Physical(local_a8);
        pCVar7 = CVar13.list;
        local_f8.physical = CVar13.physical;
        if (((undefined1  [16])CVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          pCVar2 = (pCVar7->columns).
                   super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                   .
                   super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          local_f8.end = ((long)pCVar2 -
                          (long)(pCVar7->columns).
                                super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                .
                                super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x7b425ed097b425ed;
          iVar11 = ((long)pCVar2 -
                    (long)(pCVar7->columns).
                          super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          .
                          super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
        }
        else {
          iVar11 = (long)(pCVar7->physical_columns).
                         super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(pCVar7->physical_columns).
                         super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3;
          local_f8.end = iVar11;
        }
        local_f8.pos = 0;
        local_f8.list = pCVar7;
        while (((local_f8.pos != iVar11 || (local_f8.end != iVar11)) || (local_f8.list != pCVar7)))
        {
          pCVar8 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*
                             (&local_f8);
          local_50 = (__node_base_ptr)ColumnDefinition::Physical(pCVar8);
          local_a0 = (_Hashtable<duckdb::PhysicalIndex,duckdb::PhysicalIndex,std::allocator<duckdb::PhysicalIndex>,std::__detail::_Identity,std::equal_to<duckdb::PhysicalIndex>,duckdb::PhysicalIndexHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)local_98;
          ::std::
          _Hashtable<duckdb::PhysicalIndex,duckdb::PhysicalIndex,std::allocator<duckdb::PhysicalIndex>,std::__detail::_Identity,std::equal_to<duckdb::PhysicalIndex>,duckdb::PhysicalIndexHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<duckdb::PhysicalIndex,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::PhysicalIndex,true>>>>
                    ((_Hashtable<duckdb::PhysicalIndex,duckdb::PhysicalIndex,std::allocator<duckdb::PhysicalIndex>,std::__detail::_Identity,std::equal_to<duckdb::PhysicalIndex>,duckdb::PhysicalIndexHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)local_98,&local_50,&local_a0);
          local_f8.pos = local_f8.pos + 1;
        }
        LogicalUpdate::BindExtraColumns
                  (this,local_b8,local_b0,update,(physical_index_set_t *)local_98);
        ::std::
        _Hashtable<duckdb::PhysicalIndex,_duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::PhysicalIndex>,_duckdb::PhysicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable((_Hashtable<duckdb::PhysicalIndex,_duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::PhysicalIndex>,_duckdb::PhysicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       *)local_98);
      }
      ::std::vector<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_>::~vector
                ((vector<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_> *)(local_d8 + 8));
      ::std::
      vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
      ::~vector(&local_48);
      return;
    }
    pCVar8 = ColumnList::GetColumn(local_a8,(PhysicalIndex)pPVar12->index);
    this_00 = ColumnDefinition::Type(pCVar8);
    bVar4 = LogicalType::SupportsRegularUpdate(this_00);
    if (!bVar4) {
      update->update_is_del_and_insert = true;
      goto LAB_0156cd1a;
    }
    pPVar12 = pPVar12 + 1;
  } while( true );
}

Assistant:

void TableCatalogEntry::BindUpdateConstraints(Binder &binder, LogicalGet &get, LogicalProjection &proj,
                                              LogicalUpdate &update, ClientContext &context) {
	// check the constraints and indexes of the table to see if we need to project any additional columns
	// we do this for indexes with multiple columns and CHECK constraints in the UPDATE clause
	// suppose we have a constraint CHECK(i + j < 10); now we need both i and j to check the constraint
	// if we are only updating one of the two columns we add the other one to the UPDATE set
	// with a "useless" update (i.e. i=i) so we can verify that the CHECK constraint is not violated
	auto bound_constraints = binder.BindConstraints(constraints, name, columns);
	for (auto &constraint : bound_constraints) {
		if (constraint->type == ConstraintType::CHECK) {
			auto &check = constraint->Cast<BoundCheckConstraint>();
			// check constraint! check if we need to add any extra columns to the UPDATE clause
			LogicalUpdate::BindExtraColumns(*this, get, proj, update, check.bound_columns);
		}
	}
	if (update.return_chunk) {
		physical_index_set_t all_columns;
		for (auto &column : GetColumns().Physical()) {
			all_columns.insert(column.Physical());
		}
		LogicalUpdate::BindExtraColumns(*this, get, proj, update, all_columns);
	}
	// for index updates we always turn any update into an insert and a delete
	// we thus need all the columns to be available, hence we check if the update touches any index columns
	// If the returning keyword is used, we need access to the whole row in case the user requests it.
	// Therefore switch the update to a delete and insert.
	update.update_is_del_and_insert = false;
	TableStorageInfo table_storage_info = GetStorageInfo(context);
	for (auto index : table_storage_info.index_info) {
		for (auto &column : update.columns) {
			if (index.column_set.find(column.index) != index.column_set.end()) {
				update.update_is_del_and_insert = true;
				break;
			}
		}
	};

	// we also convert any updates on LIST columns into delete + insert
	for (auto &col_index : update.columns) {
		auto &column = GetColumns().GetColumn(col_index);
		if (!column.Type().SupportsRegularUpdate()) {
			update.update_is_del_and_insert = true;
			break;
		}
	}

	if (update.update_is_del_and_insert) {
		// the update updates a column required by an index or requires returning the updated rows,
		// push projections for all columns
		physical_index_set_t all_columns;
		for (auto &column : GetColumns().Physical()) {
			all_columns.insert(column.Physical());
		}
		LogicalUpdate::BindExtraColumns(*this, get, proj, update, all_columns);
	}
}